

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::IncrementVarUsage(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *this,int v)

{
  int iVar1;
  int *piVar2;
  ConInfo *pCVar3;
  Error *this_00;
  
  piVar2 = VarUsageRef(this,v);
  *piVar2 = *piVar2 + 1;
  pCVar3 = GetInitExpression(this,v);
  iVar1 = (*pCVar3->pck_->_vptr_BasicConstraintKeeper[0x21])
                    (pCVar3->pck_,(ulong)(uint)pCVar3->index_);
  if ((char)iVar1 != '\0') {
    pCVar3 = GetInitExpression(this,v);
    iVar1 = (*pCVar3->pck_->_vptr_BasicConstraintKeeper[0x20])
                      (pCVar3->pck_,(ulong)(uint)pCVar3->index_);
    if ((char)iVar1 == '\0') {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x367ee0,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
  }
  return;
}

Assistant:

void IncrementVarUsage(int v) {
		++VarUsageRef(v);
    // If unused, no reformulation tried,
    // currently no repetition of reformulation cycle.
    MP_ASSERT_ALWAYS(!IsUnused(GetInitExpression(v))
        || IsBridgingToBeConsidered(GetInitExpression(v)),
                     "An expression's redefinition\n"
                     "could be lost. Please contact\n"
                     "AMPL customer support.");
	}